

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBFArrayBox.cpp
# Opt level: O0

FArrayBox * __thiscall amrex::EBFArrayBox::getBndryAreaData(EBFArrayBox *this)

{
  bool bVar1;
  MultiCutFab *in_RDI;
  MultiCutFab *mf;
  int in_stack_ffffffffffffffdc;
  FArrayBox *local_8;
  
  if (((in_RDI->m_data).super_FabArrayBase.boxarray.m_ref.
       super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0)
     || (*(int *)&(in_RDI->m_data).super_FabArrayBase.boxarray.m_ref.
                  super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi < 0
        )) {
    local_8 = (FArrayBox *)0x0;
  }
  else {
    EBFArrayBoxFactory::getBndryArea((EBFArrayBoxFactory *)in_RDI);
    bVar1 = MultiCutFab::ok(in_RDI,in_stack_ffffffffffffffdc);
    if (bVar1) {
      local_8 = &MultiCutFab::operator[](in_RDI,in_stack_ffffffffffffffdc)->super_FArrayBox;
    }
    else {
      local_8 = (FArrayBox *)0x0;
    }
  }
  return local_8;
}

Assistant:

const FArrayBox*
EBFArrayBox::getBndryAreaData () const
{
    if (m_factory && m_box_index >= 0) {
        MultiCutFab const& mf = m_factory->getBndryArea();
        if (mf.ok(m_box_index)) {
            return &(mf[m_box_index]);
        } else {
            return nullptr;
        }
    } else {
        return nullptr;
    }
}